

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O2

int32_t nghttp2_submit_push_promise
                  (nghttp2_session *session,uint8_t flags,int32_t stream_id,nghttp2_nv *nva,
                  size_t nvlen,void *promised_stream_user_data)

{
  nghttp2_mem *mem;
  uint32_t promised_stream_id;
  int iVar1;
  int iVar2;
  nghttp2_outbound_item *item;
  nghttp2_nv *nva_copy;
  
  iVar2 = -0x1f5;
  if ((0 < stream_id) && (iVar1 = nghttp2_session_is_my_stream_id(session,stream_id), iVar1 == 0)) {
    if (session->server == '\0') {
      iVar2 = -0x1f9;
    }
    else if ((int)session->next_stream_id < 0) {
      iVar2 = -0x1fd;
    }
    else {
      mem = &session->mem;
      item = (nghttp2_outbound_item *)nghttp2_mem_malloc(mem,0xa0);
      if (item == (nghttp2_outbound_item *)0x0) {
        iVar2 = -0x385;
      }
      else {
        nghttp2_outbound_item_init(item);
        (item->aux_data).headers.stream_user_data = promised_stream_user_data;
        iVar2 = nghttp2_nv_array_copy(&nva_copy,nva,nvlen,mem);
        if (-1 < iVar2) {
          promised_stream_id = session->next_stream_id;
          session->next_stream_id = promised_stream_id + 2;
          nghttp2_frame_push_promise_init
                    ((nghttp2_push_promise *)item,'\x04',stream_id,promised_stream_id,nva_copy,nvlen
                    );
          iVar2 = nghttp2_session_add_item(session,item);
          if (iVar2 == 0) {
            return promised_stream_id;
          }
          nghttp2_frame_push_promise_free((nghttp2_push_promise *)item,mem);
        }
        nghttp2_mem_free(mem,item);
      }
    }
  }
  return iVar2;
}

Assistant:

int32_t nghttp2_submit_push_promise(nghttp2_session *session, uint8_t flags,
                                    int32_t stream_id, const nghttp2_nv *nva,
                                    size_t nvlen,
                                    void *promised_stream_user_data) {
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_nv *nva_copy;
  uint8_t flags_copy;
  int32_t promised_stream_id;
  int rv;
  nghttp2_mem *mem;
  (void)flags;

  mem = &session->mem;

  if (stream_id <= 0 || nghttp2_session_is_my_stream_id(session, stream_id)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (!session->server) {
    return NGHTTP2_ERR_PROTO;
  }

  /* All 32bit signed stream IDs are spent. */
  if (session->next_stream_id > INT32_MAX) {
    return NGHTTP2_ERR_STREAM_ID_NOT_AVAILABLE;
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  item->aux_data.headers.stream_user_data = promised_stream_user_data;

  frame = &item->frame;

  rv = nghttp2_nv_array_copy(&nva_copy, nva, nvlen, mem);
  if (rv < 0) {
    nghttp2_mem_free(mem, item);
    return rv;
  }

  flags_copy = NGHTTP2_FLAG_END_HEADERS;

  promised_stream_id = (int32_t)session->next_stream_id;
  session->next_stream_id += 2;

  nghttp2_frame_push_promise_init(&frame->push_promise, flags_copy, stream_id,
                                  promised_stream_id, nva_copy, nvlen);

  rv = nghttp2_session_add_item(session, item);

  if (rv != 0) {
    nghttp2_frame_push_promise_free(&frame->push_promise, mem);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  return promised_stream_id;
}